

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O1

int jpc_dec_cp_setfromqcc(jpc_dec_cp_t *cp,jpc_qcc_t *qcc)

{
  jpc_dec_ccp_t *pjVar1;
  uint_fast16_t *puVar2;
  jpc_dec_ccp_t *pjVar3;
  uint_fast16_t uVar4;
  uint_fast16_t uVar5;
  
  uVar4 = qcc->compno;
  pjVar3 = cp->ccps;
  pjVar1 = pjVar3 + uVar4;
  pjVar1->flags = pjVar1->flags | 10;
  pjVar3 = pjVar3 + uVar4;
  uVar4 = (uint_fast16_t)(qcc->compparms).numstepsizes;
  if (0 < (long)uVar4) {
    puVar2 = (qcc->compparms).stepsizes;
    uVar5 = 0;
    do {
      pjVar3->stepsizes[uVar5] = puVar2[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  pjVar3->numstepsizes = uVar4;
  pjVar3->numguardbits = (qcc->compparms).numguard;
  pjVar3->qsty = (qcc->compparms).qntsty;
  return (int)pjVar3;
}

Assistant:

static int jpc_dec_cp_setfromqcc(jpc_dec_cp_t *cp, jpc_qcc_t *qcc)
{
	return jpc_dec_cp_setfromqcx(cp, &cp->ccps[qcc->compno], &qcc->compparms, JPC_QCC);
}